

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxResidualActivity
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int rowNumber,int colNumber,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minAct,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxAct)

{
  Item *pIVar1;
  Tolerances *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Real RVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  long lVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  bool bVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long in_FS_OFFSET;
  byte bVar19;
  cpp_dec_float<200U,_int,_void> local_4f8;
  ulong local_470;
  cpp_dec_float<200U,_int,_void> *local_468;
  cpp_dec_float<200U,_int,_void> *local_460;
  double local_458;
  undefined8 uStack_450;
  undefined4 local_448;
  uint uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar19 = 0;
  pIVar1 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar7 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[rowNumber].idx;
  bVar12 = false;
  local_460 = &minAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&minAct->m_backend,0);
  local_468 = &maxAct->m_backend;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&maxAct->m_backend,0);
  if (pIVar1[iVar7].data.
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused < 1) {
    uVar17 = 0;
  }
  else {
    pIVar1 = pIVar1 + iVar7;
    local_458 = *(double *)(in_FS_OFFSET + -8);
    local_448 = SUB84(local_458,0);
    uStack_450 = 0;
    uStack_444 = (uint)((ulong)local_458 >> 0x20) ^ 0x80000000;
    uStack_440 = 0;
    uStack_43c = 0x80000000;
    lVar18 = 0;
    lVar16 = 0;
    local_470 = 0;
    bVar12 = false;
    do {
      if ((colNumber < 0) ||
         (*(int *)((long)(&((pIVar1->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem)->val + 1) + lVar18) != colNumber)) {
        pNVar11 = (pIVar1->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        puVar14 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
        pnVar15 = &local_b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = *puVar14;
          puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
        local_b0.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
        local_b0.m_backend._120_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
        local_2b8.m_backend.fpclass = cpp_dec_float_finite;
        local_2b8.m_backend.prec_elem = 0x1c;
        local_2b8.m_backend.data._M_elems[0] = 0;
        local_2b8.m_backend.data._M_elems[1] = 0;
        local_2b8.m_backend.data._M_elems[2] = 0;
        local_2b8.m_backend.data._M_elems[3] = 0;
        local_2b8.m_backend.data._M_elems[4] = 0;
        local_2b8.m_backend.data._M_elems[5] = 0;
        local_2b8.m_backend.data._M_elems[6] = 0;
        local_2b8.m_backend.data._M_elems[7] = 0;
        local_2b8.m_backend.data._M_elems[8] = 0;
        local_2b8.m_backend.data._M_elems[9] = 0;
        local_2b8.m_backend.data._M_elems[10] = 0;
        local_2b8.m_backend.data._M_elems[0xb] = 0;
        local_2b8.m_backend.data._M_elems[0xc] = 0;
        local_2b8.m_backend.data._M_elems[0xd] = 0;
        local_2b8.m_backend.data._M_elems[0xe] = 0;
        local_2b8.m_backend.data._M_elems[0xf] = 0;
        local_2b8.m_backend.data._M_elems[0x10] = 0;
        local_2b8.m_backend.data._M_elems[0x11] = 0;
        local_2b8.m_backend.data._M_elems[0x12] = 0;
        local_2b8.m_backend.data._M_elems[0x13] = 0;
        local_2b8.m_backend.data._M_elems[0x14] = 0;
        local_2b8.m_backend.data._M_elems[0x15] = 0;
        local_2b8.m_backend.data._M_elems[0x16] = 0;
        local_2b8.m_backend.data._M_elems[0x17] = 0;
        local_2b8.m_backend.data._M_elems[0x18] = 0;
        local_2b8.m_backend.data._M_elems[0x19] = 0;
        local_2b8.m_backend.data._M_elems._104_5_ = 0;
        local_2b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_2b8.m_backend.exp = 0;
        local_2b8.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_2b8,0.0);
        pTVar2 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var3 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        RVar4 = Tolerances::epsilon(pTVar2);
        bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_b0,&local_2b8,RVar4);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pNVar11 = (pIVar1->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if (bVar6) {
          pcVar8 = &(lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_4f8.fpclass = cpp_dec_float_finite;
          local_4f8.prec_elem = 0x1c;
          local_4f8.data._M_elems[0] = 0;
          local_4f8.data._M_elems[1] = 0;
          local_4f8.data._M_elems[2] = 0;
          local_4f8.data._M_elems[3] = 0;
          local_4f8.data._M_elems[4] = 0;
          local_4f8.data._M_elems[5] = 0;
          local_4f8.data._M_elems[6] = 0;
          local_4f8.data._M_elems[7] = 0;
          local_4f8.data._M_elems[8] = 0;
          local_4f8.data._M_elems[9] = 0;
          local_4f8.data._M_elems[10] = 0;
          local_4f8.data._M_elems[0xb] = 0;
          local_4f8.data._M_elems[0xc] = 0;
          local_4f8.data._M_elems[0xd] = 0;
          local_4f8.data._M_elems[0xe] = 0;
          local_4f8.data._M_elems[0xf] = 0;
          local_4f8.data._M_elems[0x10] = 0;
          local_4f8.data._M_elems[0x11] = 0;
          local_4f8.data._M_elems[0x12] = 0;
          local_4f8.data._M_elems[0x13] = 0;
          local_4f8.data._M_elems[0x14] = 0;
          local_4f8.data._M_elems[0x15] = 0;
          local_4f8.data._M_elems[0x16] = 0;
          local_4f8.data._M_elems[0x17] = 0;
          local_4f8.data._M_elems[0x18] = 0;
          local_4f8.data._M_elems[0x19] = 0;
          local_4f8.data._M_elems._104_5_ = 0;
          local_4f8.data._M_elems[0x1b]._1_3_ = 0;
          local_4f8.exp = 0;
          local_4f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_4f8,
                     (double)CONCAT44(uStack_444,local_448));
          if (((pcVar8->fpclass == cpp_dec_float_NaN) || (local_4f8.fpclass == cpp_dec_float_NaN))
             || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar8,&local_4f8), 0 < iVar7)) {
            pNVar11 = (pIVar1->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pcVar8 = &(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
LAB_00590a8b:
            local_4f8.fpclass = cpp_dec_float_finite;
            local_4f8.prec_elem = 0x1c;
            local_4f8.neg = false;
            local_4f8.exp = 0;
            local_4f8.data._M_elems[0x1b]._1_3_ = 0;
            local_4f8.data._M_elems._104_5_ = 0;
            local_4f8.data._M_elems[0x18] = 0;
            local_4f8.data._M_elems[0x19] = 0;
            local_4f8.data._M_elems[0x16] = 0;
            local_4f8.data._M_elems[0x17] = 0;
            local_4f8.data._M_elems[0x14] = 0;
            local_4f8.data._M_elems[0x15] = 0;
            local_4f8.data._M_elems[0x12] = 0;
            local_4f8.data._M_elems[0x13] = 0;
            local_4f8.data._M_elems[0x10] = 0;
            local_4f8.data._M_elems[0x11] = 0;
            local_4f8.data._M_elems[0xe] = 0;
            local_4f8.data._M_elems[0xf] = 0;
            local_4f8.data._M_elems[0xc] = 0;
            local_4f8.data._M_elems[0xd] = 0;
            local_4f8.data._M_elems[10] = 0;
            local_4f8.data._M_elems[0xb] = 0;
            local_4f8.data._M_elems[8] = 0;
            local_4f8.data._M_elems[9] = 0;
            local_4f8.data._M_elems[6] = 0;
            local_4f8.data._M_elems[7] = 0;
            local_4f8.data._M_elems[4] = 0;
            local_4f8.data._M_elems[5] = 0;
            local_4f8.data._M_elems[2] = 0;
            local_4f8.data._M_elems[3] = 0;
            local_4f8.data._M_elems[0] = 0;
            local_4f8.data._M_elems[1] = 0;
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&(pNVar11->val).m_backend.data + lVar18);
            pcVar9 = pcVar13;
            if ((&local_4f8 != pcVar8) && (pcVar9 = pcVar8, pcVar13 != &local_4f8)) {
              pcVar8 = &local_4f8;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar8->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
              }
              local_4f8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
              local_4f8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
              local_4f8._120_8_ =
                   *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_4f8,pcVar9);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (local_460,&local_4f8);
            bVar5 = bVar12;
          }
          else {
            bVar5 = true;
          }
        }
        else {
          puVar14 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
          pnVar15 = &local_130;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
          local_130.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
          local_130.m_backend._120_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
          local_338.m_backend.fpclass = cpp_dec_float_finite;
          local_338.m_backend.prec_elem = 0x1c;
          local_338.m_backend.data._M_elems[0] = 0;
          local_338.m_backend.data._M_elems[1] = 0;
          local_338.m_backend.data._M_elems[2] = 0;
          local_338.m_backend.data._M_elems[3] = 0;
          local_338.m_backend.data._M_elems[4] = 0;
          local_338.m_backend.data._M_elems[5] = 0;
          local_338.m_backend.data._M_elems[6] = 0;
          local_338.m_backend.data._M_elems[7] = 0;
          local_338.m_backend.data._M_elems[8] = 0;
          local_338.m_backend.data._M_elems[9] = 0;
          local_338.m_backend.data._M_elems[10] = 0;
          local_338.m_backend.data._M_elems[0xb] = 0;
          local_338.m_backend.data._M_elems[0xc] = 0;
          local_338.m_backend.data._M_elems[0xd] = 0;
          local_338.m_backend.data._M_elems[0xe] = 0;
          local_338.m_backend.data._M_elems[0xf] = 0;
          local_338.m_backend.data._M_elems[0x10] = 0;
          local_338.m_backend.data._M_elems[0x11] = 0;
          local_338.m_backend.data._M_elems[0x12] = 0;
          local_338.m_backend.data._M_elems[0x13] = 0;
          local_338.m_backend.data._M_elems[0x14] = 0;
          local_338.m_backend.data._M_elems[0x15] = 0;
          local_338.m_backend.data._M_elems[0x16] = 0;
          local_338.m_backend.data._M_elems[0x17] = 0;
          local_338.m_backend.data._M_elems[0x18] = 0;
          local_338.m_backend.data._M_elems[0x19] = 0;
          local_338.m_backend.data._M_elems._104_5_ = 0;
          local_338.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_338.m_backend.exp = 0;
          local_338.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_338,0.0);
          pTVar2 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          RVar4 = Tolerances::epsilon(pTVar2);
          bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_130,&local_338,RVar4);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          bVar5 = bVar12;
          if (bVar6) {
            pcVar8 = &(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&((pIVar1->data).
                                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem)->val + 1) + lVar18)].m_backend;
            ::soplex::infinity::__tls_init();
            local_4f8.fpclass = cpp_dec_float_finite;
            local_4f8.prec_elem = 0x1c;
            local_4f8.data._M_elems[0] = 0;
            local_4f8.data._M_elems[1] = 0;
            local_4f8.data._M_elems[2] = 0;
            local_4f8.data._M_elems[3] = 0;
            local_4f8.data._M_elems[4] = 0;
            local_4f8.data._M_elems[5] = 0;
            local_4f8.data._M_elems[6] = 0;
            local_4f8.data._M_elems[7] = 0;
            local_4f8.data._M_elems[8] = 0;
            local_4f8.data._M_elems[9] = 0;
            local_4f8.data._M_elems[10] = 0;
            local_4f8.data._M_elems[0xb] = 0;
            local_4f8.data._M_elems[0xc] = 0;
            local_4f8.data._M_elems[0xd] = 0;
            local_4f8.data._M_elems[0xe] = 0;
            local_4f8.data._M_elems[0xf] = 0;
            local_4f8.data._M_elems[0x10] = 0;
            local_4f8.data._M_elems[0x11] = 0;
            local_4f8.data._M_elems[0x12] = 0;
            local_4f8.data._M_elems[0x13] = 0;
            local_4f8.data._M_elems[0x14] = 0;
            local_4f8.data._M_elems[0x15] = 0;
            local_4f8.data._M_elems[0x16] = 0;
            local_4f8.data._M_elems[0x17] = 0;
            local_4f8.data._M_elems[0x18] = 0;
            local_4f8.data._M_elems[0x19] = 0;
            local_4f8.data._M_elems._104_5_ = 0;
            local_4f8.data._M_elems[0x1b]._1_3_ = 0;
            local_4f8.exp = 0;
            local_4f8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_4f8,local_458);
            if ((pcVar8->fpclass != cpp_dec_float_NaN) && (local_4f8.fpclass != cpp_dec_float_NaN))
            {
              iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar8,&local_4f8);
              bVar5 = true;
              if (-1 < iVar7) goto LAB_00590aeb;
            }
            pNVar11 = (pIVar1->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pcVar8 = &(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
            goto LAB_00590a8b;
          }
        }
LAB_00590aeb:
        bVar12 = bVar5;
        pNVar11 = (pIVar1->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        puVar14 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
        pnVar15 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = *puVar14;
          puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
        local_1b0.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
        local_1b0.m_backend._120_8_ =
             *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
        local_3b8.m_backend.fpclass = cpp_dec_float_finite;
        local_3b8.m_backend.prec_elem = 0x1c;
        local_3b8.m_backend.data._M_elems[0] = 0;
        local_3b8.m_backend.data._M_elems[1] = 0;
        local_3b8.m_backend.data._M_elems[2] = 0;
        local_3b8.m_backend.data._M_elems[3] = 0;
        local_3b8.m_backend.data._M_elems[4] = 0;
        local_3b8.m_backend.data._M_elems[5] = 0;
        local_3b8.m_backend.data._M_elems[6] = 0;
        local_3b8.m_backend.data._M_elems[7] = 0;
        local_3b8.m_backend.data._M_elems[8] = 0;
        local_3b8.m_backend.data._M_elems[9] = 0;
        local_3b8.m_backend.data._M_elems[10] = 0;
        local_3b8.m_backend.data._M_elems[0xb] = 0;
        local_3b8.m_backend.data._M_elems[0xc] = 0;
        local_3b8.m_backend.data._M_elems[0xd] = 0;
        local_3b8.m_backend.data._M_elems[0xe] = 0;
        local_3b8.m_backend.data._M_elems[0xf] = 0;
        local_3b8.m_backend.data._M_elems[0x10] = 0;
        local_3b8.m_backend.data._M_elems[0x11] = 0;
        local_3b8.m_backend.data._M_elems[0x12] = 0;
        local_3b8.m_backend.data._M_elems[0x13] = 0;
        local_3b8.m_backend.data._M_elems[0x14] = 0;
        local_3b8.m_backend.data._M_elems[0x15] = 0;
        local_3b8.m_backend.data._M_elems[0x16] = 0;
        local_3b8.m_backend.data._M_elems[0x17] = 0;
        local_3b8.m_backend.data._M_elems[0x18] = 0;
        local_3b8.m_backend.data._M_elems[0x19] = 0;
        local_3b8.m_backend.data._M_elems._104_5_ = 0;
        local_3b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3b8.m_backend.exp = 0;
        local_3b8.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3b8,0.0);
        pTVar2 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var3 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        RVar4 = Tolerances::epsilon(pTVar2);
        bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_1b0,&local_3b8,RVar4);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        pNVar11 = (pIVar1->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        if (bVar6) {
          pcVar8 = &(lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_4f8.fpclass = cpp_dec_float_finite;
          local_4f8.prec_elem = 0x1c;
          local_4f8.data._M_elems[0] = 0;
          local_4f8.data._M_elems[1] = 0;
          local_4f8.data._M_elems[2] = 0;
          local_4f8.data._M_elems[3] = 0;
          local_4f8.data._M_elems[4] = 0;
          local_4f8.data._M_elems[5] = 0;
          local_4f8.data._M_elems[6] = 0;
          local_4f8.data._M_elems[7] = 0;
          local_4f8.data._M_elems[8] = 0;
          local_4f8.data._M_elems[9] = 0;
          local_4f8.data._M_elems[10] = 0;
          local_4f8.data._M_elems[0xb] = 0;
          local_4f8.data._M_elems[0xc] = 0;
          local_4f8.data._M_elems[0xd] = 0;
          local_4f8.data._M_elems[0xe] = 0;
          local_4f8.data._M_elems[0xf] = 0;
          local_4f8.data._M_elems[0x10] = 0;
          local_4f8.data._M_elems[0x11] = 0;
          local_4f8.data._M_elems[0x12] = 0;
          local_4f8.data._M_elems[0x13] = 0;
          local_4f8.data._M_elems[0x14] = 0;
          local_4f8.data._M_elems[0x15] = 0;
          local_4f8.data._M_elems[0x16] = 0;
          local_4f8.data._M_elems[0x17] = 0;
          local_4f8.data._M_elems[0x18] = 0;
          local_4f8.data._M_elems[0x19] = 0;
          local_4f8.data._M_elems._104_5_ = 0;
          local_4f8.data._M_elems[0x1b]._1_3_ = 0;
          local_4f8.exp = 0;
          local_4f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_4f8,local_458);
          if ((pcVar8->fpclass != cpp_dec_float_NaN) && (local_4f8.fpclass != cpp_dec_float_NaN)) {
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar8,&local_4f8);
            if (-1 < iVar7) {
              local_470 = CONCAT71((int7)(CONCAT44(extraout_var,iVar7) >> 8),1);
              goto LAB_0059101d;
            }
          }
          pNVar11 = (pIVar1->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar11->val).m_backend.data + lVar18)
          ;
          pcVar13 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          local_4f8.fpclass = cpp_dec_float_finite;
          local_4f8.prec_elem = 0x1c;
          local_4f8.data._M_elems[0] = 0;
          local_4f8.data._M_elems[1] = 0;
          local_4f8.data._M_elems[2] = 0;
          local_4f8.data._M_elems[3] = 0;
          local_4f8.data._M_elems[4] = 0;
          local_4f8.data._M_elems[5] = 0;
          local_4f8.data._M_elems[6] = 0;
          local_4f8.data._M_elems[7] = 0;
          local_4f8.data._M_elems[8] = 0;
          local_4f8.data._M_elems[9] = 0;
          local_4f8.data._M_elems[10] = 0;
          local_4f8.data._M_elems[0xb] = 0;
          local_4f8.data._M_elems[0xc] = 0;
          local_4f8.data._M_elems[0xd] = 0;
          local_4f8.data._M_elems[0xe] = 0;
          local_4f8.data._M_elems[0xf] = 0;
          local_4f8.data._M_elems[0x10] = 0;
          local_4f8.data._M_elems[0x11] = 0;
          local_4f8.data._M_elems[0x12] = 0;
          local_4f8.data._M_elems[0x13] = 0;
          local_4f8.data._M_elems[0x14] = 0;
          local_4f8.data._M_elems[0x15] = 0;
          local_4f8.data._M_elems[0x16] = 0;
          local_4f8.data._M_elems[0x17] = 0;
          local_4f8.data._M_elems[0x18] = 0;
          local_4f8.data._M_elems[0x19] = 0;
          local_4f8.data._M_elems._104_5_ = 0;
          local_4f8.data._M_elems[0x1b]._1_3_ = 0;
          local_4f8.exp = 0;
          local_4f8.neg = false;
          pcVar9 = pcVar8;
          if ((&local_4f8 != pcVar13) && (pcVar9 = pcVar13, pcVar8 != &local_4f8)) {
            pcVar13 = &local_4f8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar8->data)._M_elems[0];
              pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
            }
            local_4f8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
            local_4f8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
            local_4f8._120_8_ =
                 *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
          }
        }
        else {
          puVar14 = (uint *)((long)&(pNVar11->val).m_backend.data + lVar18);
          pnVar15 = &local_230;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          local_230.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
          local_230.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
          local_230.m_backend._120_8_ =
               *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
          local_438.m_backend.fpclass = cpp_dec_float_finite;
          local_438.m_backend.prec_elem = 0x1c;
          local_438.m_backend.data._M_elems[0] = 0;
          local_438.m_backend.data._M_elems[1] = 0;
          local_438.m_backend.data._M_elems[2] = 0;
          local_438.m_backend.data._M_elems[3] = 0;
          local_438.m_backend.data._M_elems[4] = 0;
          local_438.m_backend.data._M_elems[5] = 0;
          local_438.m_backend.data._M_elems[6] = 0;
          local_438.m_backend.data._M_elems[7] = 0;
          local_438.m_backend.data._M_elems[8] = 0;
          local_438.m_backend.data._M_elems[9] = 0;
          local_438.m_backend.data._M_elems[10] = 0;
          local_438.m_backend.data._M_elems[0xb] = 0;
          local_438.m_backend.data._M_elems[0xc] = 0;
          local_438.m_backend.data._M_elems[0xd] = 0;
          local_438.m_backend.data._M_elems[0xe] = 0;
          local_438.m_backend.data._M_elems[0xf] = 0;
          local_438.m_backend.data._M_elems[0x10] = 0;
          local_438.m_backend.data._M_elems[0x11] = 0;
          local_438.m_backend.data._M_elems[0x12] = 0;
          local_438.m_backend.data._M_elems[0x13] = 0;
          local_438.m_backend.data._M_elems[0x14] = 0;
          local_438.m_backend.data._M_elems[0x15] = 0;
          local_438.m_backend.data._M_elems[0x16] = 0;
          local_438.m_backend.data._M_elems[0x17] = 0;
          local_438.m_backend.data._M_elems[0x18] = 0;
          local_438.m_backend.data._M_elems[0x19] = 0;
          local_438.m_backend.data._M_elems._104_5_ = 0;
          local_438.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          local_438.m_backend.exp = 0;
          local_438.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_438,0.0);
          pTVar2 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          p_Var3 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          RVar4 = Tolerances::epsilon(pTVar2);
          bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_230,&local_438,RVar4);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (!bVar6) goto LAB_0059101d;
          pcVar8 = &(lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&((pIVar1->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar18)].m_backend;
          ::soplex::infinity::__tls_init();
          local_4f8.fpclass = cpp_dec_float_finite;
          local_4f8.prec_elem = 0x1c;
          local_4f8.data._M_elems[0] = 0;
          local_4f8.data._M_elems[1] = 0;
          local_4f8.data._M_elems[2] = 0;
          local_4f8.data._M_elems[3] = 0;
          local_4f8.data._M_elems[4] = 0;
          local_4f8.data._M_elems[5] = 0;
          local_4f8.data._M_elems[6] = 0;
          local_4f8.data._M_elems[7] = 0;
          local_4f8.data._M_elems[8] = 0;
          local_4f8.data._M_elems[9] = 0;
          local_4f8.data._M_elems[10] = 0;
          local_4f8.data._M_elems[0xb] = 0;
          local_4f8.data._M_elems[0xc] = 0;
          local_4f8.data._M_elems[0xd] = 0;
          local_4f8.data._M_elems[0xe] = 0;
          local_4f8.data._M_elems[0xf] = 0;
          local_4f8.data._M_elems[0x10] = 0;
          local_4f8.data._M_elems[0x11] = 0;
          local_4f8.data._M_elems[0x12] = 0;
          local_4f8.data._M_elems[0x13] = 0;
          local_4f8.data._M_elems[0x14] = 0;
          local_4f8.data._M_elems[0x15] = 0;
          local_4f8.data._M_elems[0x16] = 0;
          local_4f8.data._M_elems[0x17] = 0;
          local_4f8.data._M_elems[0x18] = 0;
          local_4f8.data._M_elems[0x19] = 0;
          local_4f8.data._M_elems._104_5_ = 0;
          local_4f8.data._M_elems[0x1b]._1_3_ = 0;
          local_4f8.exp = 0;
          local_4f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_4f8,
                     (double)CONCAT44(uStack_444,local_448));
          if ((pcVar8->fpclass != cpp_dec_float_NaN) && (local_4f8.fpclass != cpp_dec_float_NaN)) {
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar8,&local_4f8);
            if (iVar7 < 1) {
              local_470 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar7) >> 8),1);
              goto LAB_0059101d;
            }
          }
          pNVar11 = (pIVar1->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar11->val).m_backend.data + lVar18)
          ;
          pcVar13 = &(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar11->val + 1) + lVar18)].m_backend;
          local_4f8.fpclass = cpp_dec_float_finite;
          local_4f8.prec_elem = 0x1c;
          local_4f8.data._M_elems[0] = 0;
          local_4f8.data._M_elems[1] = 0;
          local_4f8.data._M_elems[2] = 0;
          local_4f8.data._M_elems[3] = 0;
          local_4f8.data._M_elems[4] = 0;
          local_4f8.data._M_elems[5] = 0;
          local_4f8.data._M_elems[6] = 0;
          local_4f8.data._M_elems[7] = 0;
          local_4f8.data._M_elems[8] = 0;
          local_4f8.data._M_elems[9] = 0;
          local_4f8.data._M_elems[10] = 0;
          local_4f8.data._M_elems[0xb] = 0;
          local_4f8.data._M_elems[0xc] = 0;
          local_4f8.data._M_elems[0xd] = 0;
          local_4f8.data._M_elems[0xe] = 0;
          local_4f8.data._M_elems[0xf] = 0;
          local_4f8.data._M_elems[0x10] = 0;
          local_4f8.data._M_elems[0x11] = 0;
          local_4f8.data._M_elems[0x12] = 0;
          local_4f8.data._M_elems[0x13] = 0;
          local_4f8.data._M_elems[0x14] = 0;
          local_4f8.data._M_elems[0x15] = 0;
          local_4f8.data._M_elems[0x16] = 0;
          local_4f8.data._M_elems[0x17] = 0;
          local_4f8.data._M_elems[0x18] = 0;
          local_4f8.data._M_elems[0x19] = 0;
          local_4f8.data._M_elems._104_5_ = 0;
          local_4f8.data._M_elems[0x1b]._1_3_ = 0;
          local_4f8.exp = 0;
          local_4f8.neg = false;
          pcVar9 = pcVar8;
          if ((&local_4f8 != pcVar13) && (pcVar9 = pcVar13, pcVar8 != &local_4f8)) {
            pcVar13 = &local_4f8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar8->data)._M_elems[0];
              pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
            }
            local_4f8.exp = *(int *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x70);
            local_4f8.neg = *(bool *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x74);
            local_4f8._120_8_ =
                 *(undefined8 *)((long)&(pNVar11->val).m_backend.data + lVar18 + 0x78);
          }
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_4f8,pcVar9);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (local_468,&local_4f8);
      }
LAB_0059101d:
      lVar16 = lVar16 + 1;
      lVar18 = lVar18 + 0x84;
      uVar17 = local_470;
    } while (lVar16 < (pIVar1->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  if (bVar12) {
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x1c;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems[0xe] = 0;
    local_4f8.data._M_elems[0xf] = 0;
    local_4f8.data._M_elems[0x10] = 0;
    local_4f8.data._M_elems[0x11] = 0;
    local_4f8.data._M_elems[0x12] = 0;
    local_4f8.data._M_elems[0x13] = 0;
    local_4f8.data._M_elems[0x14] = 0;
    local_4f8.data._M_elems[0x15] = 0;
    local_4f8.data._M_elems[0x16] = 0;
    local_4f8.data._M_elems[0x17] = 0;
    local_4f8.data._M_elems[0x18] = 0;
    local_4f8.data._M_elems[0x19] = 0;
    local_4f8.data._M_elems._104_5_ = 0;
    local_4f8.data._M_elems[0x1b]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_4f8,-*(double *)(in_FS_OFFSET + -8));
    pcVar8 = &local_4f8;
    pcVar9 = local_460;
    for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar9->data)->data)._M_elems[0] =
           (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
    }
    local_460->exp = local_4f8.exp;
    local_460->neg = local_4f8.neg;
    local_460->fpclass = local_4f8.fpclass;
    local_460->prec_elem = local_4f8.prec_elem;
  }
  if ((uVar17 & 1) != 0) {
    ::soplex::infinity::__tls_init();
    local_4f8.fpclass = cpp_dec_float_finite;
    local_4f8.prec_elem = 0x1c;
    local_4f8.data._M_elems[0] = 0;
    local_4f8.data._M_elems[1] = 0;
    local_4f8.data._M_elems[2] = 0;
    local_4f8.data._M_elems[3] = 0;
    local_4f8.data._M_elems[4] = 0;
    local_4f8.data._M_elems[5] = 0;
    local_4f8.data._M_elems[6] = 0;
    local_4f8.data._M_elems[7] = 0;
    local_4f8.data._M_elems[8] = 0;
    local_4f8.data._M_elems[9] = 0;
    local_4f8.data._M_elems[10] = 0;
    local_4f8.data._M_elems[0xb] = 0;
    local_4f8.data._M_elems[0xc] = 0;
    local_4f8.data._M_elems[0xd] = 0;
    local_4f8.data._M_elems[0xe] = 0;
    local_4f8.data._M_elems[0xf] = 0;
    local_4f8.data._M_elems[0x10] = 0;
    local_4f8.data._M_elems[0x11] = 0;
    local_4f8.data._M_elems[0x12] = 0;
    local_4f8.data._M_elems[0x13] = 0;
    local_4f8.data._M_elems[0x14] = 0;
    local_4f8.data._M_elems[0x15] = 0;
    local_4f8.data._M_elems[0x16] = 0;
    local_4f8.data._M_elems[0x17] = 0;
    local_4f8.data._M_elems[0x18] = 0;
    local_4f8.data._M_elems[0x19] = 0;
    local_4f8.data._M_elems._104_5_ = 0;
    local_4f8.data._M_elems[0x1b]._1_3_ = 0;
    local_4f8.exp = 0;
    local_4f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_4f8,*(double *)(in_FS_OFFSET + -8));
    pcVar8 = &local_4f8;
    pcVar9 = local_468;
    for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar9->data)->data)._M_elems[0] =
           (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
    }
    local_468->exp = local_4f8.exp;
    local_468->neg = local_4f8.neg;
    local_468->fpclass = local_4f8.fpclass;
    local_468->prec_elem = local_4f8.prec_elem;
  }
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxResidualActivity(SPxLPBase<R>& lp, int rowNumber, int colNumber,
      R& minAct, R& maxAct)
{
   const SVectorBase<R>& row = lp.rowVector(rowNumber);
   bool minNegInfinite = false;
   bool maxInfinite = false;

   minAct = 0;   // this is the minimum value that the aggregation can attain
   maxAct = 0;   // this is the maximum value that the aggregation can attain

   for(int l = 0; l < row.size(); ++l)
   {
      if(colNumber < 0 || row.index(l) != colNumber)
      {
         // computing the minimum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.lower(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               minNegInfinite = true;
            else
               minAct += row.value(l) * lp.upper(row.index(l));
         }

         // computing the maximum activity of the aggregated variables
         if(GT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.upper(row.index(l)) >= R(infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.upper(row.index(l));
         }
         else if(LT(row.value(l), R(0.0), this->tolerances()->epsilon()))
         {
            if(lp.lower(row.index(l)) <= R(-infinity))
               maxInfinite = true;
            else
               maxAct += row.value(l) * lp.lower(row.index(l));
         }
      }
   }

   // if an infinite value exists for the minimum activity, then that it taken
   if(minNegInfinite)
      minAct = R(-infinity);

   // if an -infinite value exists for the maximum activity, then that value is taken
   if(maxInfinite)
      maxAct = R(infinity);
}